

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestProperties
               (ostream *stream,TestResult *result)

{
  string *str;
  ostream *poVar1;
  TestProperty *pTVar2;
  int i;
  size_type *local_b8;
  string kProperty;
  string kProperties;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string local_58;
  allocator<char> local_31;
  
  kProperty.field_2._8_8_ = &kProperties._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&kProperty.field_2 + 8),"properties","");
  local_b8 = &kProperty._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"property","");
  if (0 < (int)((ulong)((long)(result->test_properties_).
                              super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_properties_).
                             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"      <",7);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,(char *)kProperty.field_2._8_8_,(long)kProperties._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,">\n",2);
    if (0 < (int)((ulong)((long)(result->test_properties_).
                                super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(result->test_properties_).
                               super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
      i = 0;
      str = (string *)(kProperties.field_2._M_local_buf + 8);
      do {
        pTVar2 = TestResult::GetTestProperty(result,i);
        std::__ostream_insert<char,std::char_traits<char>>(stream,"        <",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (stream,(char *)local_b8,(long)kProperty._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(stream," name=\"",7);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)str,(pTVar2->key_)._M_dataplus._M_p,&local_31);
        EscapeXml(&local_58,str,true);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,local_58._M_dataplus._M_p,local_58._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)kProperties.field_2._8_8_ != &local_68) {
          operator_delete((void *)kProperties.field_2._8_8_,local_68._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream," value=\"",8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)str,(pTVar2->value_)._M_dataplus._M_p,&local_31);
        EscapeXml(&local_58,str,true);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,local_58._M_dataplus._M_p,local_58._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)kProperties.field_2._8_8_ != &local_68) {
          operator_delete((void *)kProperties.field_2._8_8_,local_68._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"/>\n",3);
        i = i + 1;
      } while (i < (int)((ulong)((long)(result->test_properties_).
                                       super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(result->test_properties_).
                                      super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 6));
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"      </",8);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,(char *)kProperty.field_2._8_8_,(long)kProperties._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,">\n",2);
  }
  if (local_b8 != &kProperty._M_string_length) {
    operator_delete(local_b8,kProperty._M_string_length + 1);
  }
  if ((size_type *)kProperty.field_2._8_8_ != &kProperties._M_string_length) {
    operator_delete((void *)kProperty.field_2._8_8_,kProperties._M_string_length + 1);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestProperties(
    std::ostream* stream, const TestResult& result) {
  const std::string kProperties = "properties";
  const std::string kProperty = "property";

  if (result.test_property_count() <= 0) {
    return;
  }

  *stream << "      <" << kProperties << ">\n";
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    *stream << "        <" << kProperty;
    *stream << " name=\"" << EscapeXmlAttribute(property.key()) << "\"";
    *stream << " value=\"" << EscapeXmlAttribute(property.value()) << "\"";
    *stream << "/>\n";
  }
  *stream << "      </" << kProperties << ">\n";
}